

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

float __thiscall pbrt::SampledGrid<float>::Lookup(SampledGrid<float> *this,Point3i *p)

{
  bool bVar1;
  const_reference pvVar2;
  Point3<int> *in_RSI;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  Bounds3i sampleBounds;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  Point3<int> *in_stack_ffffffffffffffd0;
  Point3<int> *in_stack_ffffffffffffffd8;
  Bounds3<int> *in_stack_ffffffffffffffe0;
  value_type local_4;
  
  Point3<int>::Point3((Point3<int> *)in_RDI,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0);
  Point3<int>::Point3((Point3<int> *)in_RDI,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0);
  Bounds3<int>::Bounds3
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  bVar1 = InsideExclusive<int>(in_RSI,(Bounds3<int> *)&stack0xffffffffffffffd0);
  if (bVar1) {
    pvVar2 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       (in_RDI,(long)(((in_RSI->super_Tuple3<pbrt::Point3,_int>).z *
                                       *(int *)((long)&in_RDI[1].alloc.memoryResource + 4) +
                                      (in_RSI->super_Tuple3<pbrt::Point3,_int>).y) *
                                      *(int *)&in_RDI[1].alloc.memoryResource +
                                     (in_RSI->super_Tuple3<pbrt::Point3,_int>).x));
    local_4 = *pvVar2;
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU
    T Lookup(const Point3i &p) const {
        Bounds3i sampleBounds(Point3i(0, 0, 0), Point3i(nx, ny, nz));
        if (!InsideExclusive(p, sampleBounds))
            return {};
        return values[(p.z * ny + p.y) * nx + p.x];
    }